

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF::Mesh> *meshRef,Ref<glTF::Buffer> *bufferRef,
               Ref<glTF::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  void *data;
  void *data_00;
  void *pvVar10;
  char *id;
  Node *pNVar11;
  Node *pNVar12;
  Skin *pSVar13;
  size_type sVar14;
  reference this;
  Mesh *pMVar15;
  Ref<glTF::Node> RVar16;
  Ref<glTF::Accessor> RVar17;
  undefined1 local_128 [8];
  Ref<glTF::Accessor> vertexWeightAccessor;
  undefined1 local_108 [8];
  Ref<glTF::Accessor> vertexJointAccessor;
  Primitive *p;
  float vertWeight;
  uint vertexId;
  uint idx_weights;
  aiMatrix4x4 tmpMatrix4;
  uint idx_joint;
  bool addJointToJointNames;
  uint jointNamesIndex;
  undefined1 local_88 [8];
  Ref<glTF::Node> nodeRef;
  aiBone *aib;
  ulong uStack_68;
  uint idx_bone;
  size_t j;
  size_t i;
  int *jointsPerVertex;
  vec4 *vertexWeightData;
  vec4 *vertexJointData;
  size_t NumVerts;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *inverseBindMatricesData_local;
  Ref<glTF::Skin> *skinRef_local;
  Ref<glTF::Buffer> *bufferRef_local;
  Ref<glTF::Mesh> *meshRef_local;
  aiMesh *aimesh_local;
  Asset *mAsset_local;
  
  if (aimesh->mNumBones != 0) {
    uVar8 = CONCAT44(0,aimesh->mNumVertices);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    uVar9 = SUB168(auVar3 * ZEXT816(0x10),0);
    if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    data = operator_new__(uVar9);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    uVar9 = SUB168(auVar4 * ZEXT816(0x10),0);
    if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    data_00 = operator_new__(uVar9);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar8;
    uVar9 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    for (j = 0; j < uVar8; j = j + 1) {
      *(undefined4 *)((long)pvVar10 + j * 4) = 0;
      for (uStack_68 = 0; uStack_68 < 4; uStack_68 = uStack_68 + 1) {
        *(undefined4 *)((long)data + uStack_68 * 4 + j * 0x10) = 0;
        *(undefined4 *)((long)data_00 + uStack_68 * 4 + j * 0x10) = 0;
      }
    }
    for (aib._4_4_ = 0; aib._4_4_ < aimesh->mNumBones; aib._4_4_ = aib._4_4_ + 1) {
      nodeRef._8_8_ = aimesh->mBones[aib._4_4_];
      id = aiString::C_Str((aiString *)nodeRef._8_8_);
      RVar16 = glTF::LazyDict<glTF::Node>::Get(&mAsset->nodes,id);
      local_88 = (undefined1  [8])RVar16.vector;
      nodeRef.vector._0_4_ = RVar16.index;
      pNVar11 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_88);
      pNVar12 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_88);
      std::__cxx11::string::operator=
                ((string *)&pNVar12->jointName,(string *)&(pNVar11->super_Object).id);
      idx_joint = 0;
      tmpMatrix4.d4._3_1_ = 1;
      tmpMatrix4.d3 = 0.0;
      while( true ) {
        uVar8 = (ulong)(uint)tmpMatrix4.d3;
        pSVar13 = glTF::Ref<glTF::Skin>::operator->(skinRef);
        sVar14 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::size
                           (&pSVar13->jointNames);
        if (sVar14 <= uVar8) break;
        pSVar13 = glTF::Ref<glTF::Skin>::operator->(skinRef);
        this = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::
               operator[](&pSVar13->jointNames,(ulong)(uint)tmpMatrix4.d3);
        pNVar11 = glTF::Ref<glTF::Node>::operator->(this);
        glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_88);
        iVar7 = std::__cxx11::string::compare((string *)&pNVar11->jointName);
        if (iVar7 == 0) {
          tmpMatrix4.d4._3_1_ = 0;
          idx_joint = (uint)tmpMatrix4.d3;
        }
        tmpMatrix4.d3 = (float)((int)tmpMatrix4.d3 + 1);
      }
      if ((tmpMatrix4.d4._3_1_ & 1) != 0) {
        pSVar13 = glTF::Ref<glTF::Skin>::operator->(skinRef);
        std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
                  (&pSVar13->jointNames,(value_type *)local_88);
        aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&vertexId);
        CopyValue((aiMatrix4x4 *)(nodeRef._8_8_ + 0x420),(aiMatrix4x4 *)&vertexId);
        std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  (inverseBindMatricesData,(value_type *)&vertexId);
        sVar14 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           (inverseBindMatricesData);
        idx_joint = (int)sVar14 - 1;
      }
      for (vertWeight = 0.0; (uint)vertWeight < (uint)*(float *)(nodeRef._8_8_ + 0x404);
          vertWeight = (float)((int)vertWeight + 1)) {
        uVar2 = *(uint *)(*(long *)(nodeRef._8_8_ + 0x418) + (ulong)(uint)vertWeight * 8);
        uVar1 = *(undefined4 *)(*(long *)(nodeRef._8_8_ + 0x418) + 4 + (ulong)(uint)vertWeight * 8);
        if (*(int *)((long)pvVar10 + (ulong)uVar2 * 4) < 4) {
          *(float *)((long)data +
                    (long)*(int *)((long)pvVar10 + (ulong)uVar2 * 4) * 4 + (ulong)uVar2 * 0x10) =
               (float)idx_joint;
          *(undefined4 *)
           ((long)data_00 +
           (long)*(int *)((long)pvVar10 + (ulong)uVar2 * 4) * 4 + (ulong)uVar2 * 0x10) = uVar1;
          *(int *)((long)pvVar10 + (ulong)uVar2 * 4) =
               *(int *)((long)pvVar10 + (ulong)uVar2 * 4) + 1;
        }
      }
    }
    pMVar15 = glTF::Ref<glTF::Mesh>::operator->(meshRef);
    vertexJointAccessor._8_8_ =
         std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::back
                   (&pMVar15->primitives);
    pSVar13 = glTF::Ref<glTF::Skin>::operator->(skinRef);
    RVar17 = ExportData(mAsset,&(pSVar13->super_Object).id,bufferRef,aimesh->mNumVertices,data,VEC4,
                        VEC4,ComponentType_FLOAT,false);
    vertexWeightAccessor._8_8_ = RVar17.vector;
    vertexJointAccessor.vector._0_4_ = RVar17.index;
    local_108 = (undefined1  [8])vertexWeightAccessor._8_8_;
    bVar6 = glTF::Ref::operator_cast_to_bool((Ref *)local_108);
    if (bVar6) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                ((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_> *)
                 (vertexJointAccessor._8_8_ + 0x68),(value_type *)local_108);
    }
    pSVar13 = glTF::Ref<glTF::Skin>::operator->(skinRef);
    RVar17 = ExportData(mAsset,&(pSVar13->super_Object).id,bufferRef,aimesh->mNumVertices,data_00,
                        VEC4,VEC4,ComponentType_FLOAT,false);
    local_128 = (undefined1  [8])RVar17.vector;
    vertexWeightAccessor.vector._0_4_ = RVar17.index;
    bVar6 = glTF::Ref::operator_cast_to_bool((Ref *)local_128);
    if (bVar6) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                ((vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_> *)
                 (vertexJointAccessor._8_8_ + 0x98),(value_type *)local_128);
    }
    if (pvVar10 != (void *)0x0) {
      operator_delete__(pvVar10);
    }
    if (data_00 != (void *)0x0) {
      operator_delete__(data_00);
    }
    if (data != (void *)0x0) {
      operator_delete__(data);
    }
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->id;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        p.attributes.joint.push_back( vertexJointAccessor );
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}